

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationAngle.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationAngle::ArchiveOUT(ChLinkMotorRotationAngle *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorRotationAngle>(marchive);
  ChLinkMotorRotation::ArchiveOUT(&this->super_ChLinkMotorRotation,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

void ChLinkMotorRotationAngle::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorRotationAngle>();

    // serialize parent class
    ChLinkMotorRotation::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(rot_offset);
}